

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O3

double NEST::NESTcalc::GetDiffTran_Liquid
                 (double dfield,bool highFieldModel,double Kelvin,double Bar,double Density,int Z)

{
  ostream *poVar1;
  double dVar2;
  double dVar3;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> BoyleModelDT;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_20;
  
  if (Z == 0x12) {
    dVar2 = pow(dfield / 4.3660521525e+22,0.041322);
    dVar2 = dVar2 * 93.342;
  }
  else if (highFieldModel) {
    GetBoyleModelDT();
    dVar2 = interpolateFunction(&local_20,dfield,true);
    if ((dVar2 == 0.0) && (!NAN(dVar2))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Looks like your desired drift field, ",0x25);
      poVar1 = std::ostream::_M_insert<double>(dfield);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,", may be either too low or too high to interpolate a DT. Returning DT=0.\n"
                 ,0x49);
    }
    if (local_20.
        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_20.
                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_20.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_20.
                            super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    dVar3 = pow(dfield,0.093452);
    dVar2 = exp(dfield * -8.1651e-05);
    dVar2 = dVar2 * dVar3 * 37.368;
  }
  return dVar2;
}

Assistant:

double NESTcalc::GetDiffTran_Liquid(
    double dfield, bool highFieldModel, double Kelvin, double Bar, double Density,
    int Z)  // for gas: look for Diff_Tran_Gas above
{
  double output;

  if (Z == 18) {
    // G4S2Light.cc from LUXSim
    double nDensity = NEST_AVO * DENSITY / 40.;  // 1 over cm^3
    return  93.342 * pow(dfield / nDensity, 0.041322);
  }

  // Use the standard NEST parametrization
  if (!highFieldModel) {
    output = 37.368 * pow(dfield, .093452) *
             exp(-8.1651e-5 * dfield);  // arXiv:1609.04467 (EXO-200)
  }
  // Use the Boyle model, which is drastically different at high (>5kV/cm)
  // fields. Note here that the Boyle model is only at one temperature First
  // double in pair is field, second is DT
  else {
    const std::vector<std::pair<double, double> > BoyleModelDT =
        GetBoyleModelDT();
    output = interpolateFunction(BoyleModelDT, dfield, true);
    if (output == 0)
      cerr << "Looks like your desired drift field, " << dfield
           << ", may be either too low or too high to interpolate a DT. "
              "Returning DT=0.\n";
  }
  return output;
}